

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O1

void __thiscall
QSslServerPrivate::initializeHandshakeProcess(QSslServerPrivate *this,QSslSocket *socket)

{
  void **ppvVar1;
  void **ppvVar2;
  long lVar3;
  undefined4 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *pDVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  iterator iVar8;
  Connection local_68;
  QSslSocket *local_60;
  Connection destroyed;
  Connection readyRead;
  shared_ptr<QTimer> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppvVar1 = *(void ***)&(this->super_QTcpServerPrivate).field_0x8;
  readyRead.d_ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)QIODevice::readyRead;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar4 = (undefined4 *)operator_new(0x18);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/ssl/qsslserver.cpp:334:48),_QtPrivate::List<>,_void>
       ::impl;
  *(QSslServerPrivate **)(puVar4 + 4) = this;
  QObject::connectImpl
            ((QObject *)&readyRead,(void **)socket,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  destroyed.d_ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)QObject::destroyed;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar4 = (undefined4 *)operator_new(0x18);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/ssl/qsslserver.cpp:337:65),_QtPrivate::List<QObject_*>,_void>
       ::impl;
  *(QSslServerPrivate **)(puVar4 + 4) = this;
  QObject::connectImpl
            ((QObject *)&destroyed,(void **)socket,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_60 = socket;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002d6348;
  QTimer::QTimer((QTimer *)(p_Var5 + 1),(QObject *)0x0);
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var5;
  iVar8 = QHash<unsigned_long_long,QSslServerPrivate::SocketData>::
          emplace<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
                    ((QHash<unsigned_long_long,QSslServerPrivate::SocketData> *)&this->socketData,
                     (unsigned_long_long *)&local_60,&readyRead,&destroyed,&local_48);
  pDVar6 = iVar8.i.d;
  if (local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  lVar3 = (iVar8.i.bucket >> 3 & 0xfffffffffffffff0) * 9;
  uVar7 = (ulong)((uint)iVar8.i.bucket & 0x7f);
  QTimer::setSingleShot
            (SUB81(*(undefined8 *)
                    (*(long *)(pDVar6->spans->offsets + lVar3 + 0x80) + 0x18 +
                    (ulong)pDVar6->spans->offsets[uVar7 + lVar3] * 0x28),0));
  ppvVar2 = *(void ***)
             (*(long *)(pDVar6->spans->offsets + lVar3 + 0x80) + 0x18 +
             (ulong)pDVar6->spans->offsets[uVar7 + lVar3] * 0x28);
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)QTimer::timeout;
  local_48.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/ssl/qsslserver.cpp:344:40),_QtPrivate::List<>,_void>
       ::impl;
  *(QSslServerPrivate **)(puVar4 + 4) = this;
  *(QSslSocket **)(puVar4 + 6) = socket;
  QObject::connectImpl
            ((QObject *)&local_68,ppvVar2,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_68);
  QTimer::setInterval((int)*(undefined8 *)
                            (*(long *)(pDVar6->spans->offsets + lVar3 + 0x80) + 0x18 +
                            (ulong)pDVar6->spans->offsets[uVar7 + lVar3] * 0x28));
  QTimer::start();
  QMetaObject::Connection::~Connection(&destroyed);
  QMetaObject::Connection::~Connection(&readyRead);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslServerPrivate::initializeHandshakeProcess(QSslSocket *socket)
{
    Q_Q(QSslServer);
    QMetaObject::Connection readyRead = QObject::connect(
            socket, &QSslSocket::readyRead, q, [this]() { checkClientHelloAndContinue(); });

    QMetaObject::Connection destroyed =
            QObject::connect(socket, &QSslSocket::destroyed, q, [this](QObject *obj) {
                // This cast is not safe to use since the socket is inside the
                // QObject dtor, but we only use the pointer value!
                removeSocketData(quintptr(obj));
            });
    auto it = socketData.emplace(quintptr(socket), readyRead, destroyed, std::make_shared<QTimer>());
    it->timeoutTimer->setSingleShot(true);
    it->timeoutTimer->callOnTimeout(q, [this, socket]() { handleHandshakeTimedOut(socket); });
    it->timeoutTimer->setInterval(handshakeTimeout);
    it->timeoutTimer->start();
}